

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O0

void __thiscall QPlainTestLogger::outputMessage(QPlainTestLogger *this,char *str)

{
  char *in_RDI;
  QAbstractTestLogger *unaff_retaddr;
  
  QAbstractTestLogger::outputString(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void QPlainTestLogger::outputMessage(const char *str)
{
#if defined(Q_OS_WIN)
    // Log to system log only if output is not redirected and stderr not preferred
    if (stream == stdout && !QtPrivate::shouldLogToStderr()) {
        OutputDebugStringA(str);
        return;
    }
#elif defined(Q_OS_ANDROID)
    __android_log_write(ANDROID_LOG_INFO, "QTestLib", str);
#endif
    outputString(str);
}